

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

void __thiscall Apt::AddStartupLoc(Apt *this,string *_id,double _lat,double _lon,double _heading)

{
  reference pvVar1;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dAngle;
  double in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  ptTy pVar2;
  StartupLoc *loc;
  positionTy startPos;
  vectorTy vec;
  positionTy origPos;
  positionTy *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  vector<StartupLoc,_std::allocator<StartupLoc>_> *in_stack_fffffffffffffec0;
  double local_100;
  double local_f8;
  double in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff48;
  boundingBoxTy *in_stack_ffffffffffffff50;
  vectorTy local_90 [2];
  vectorTy *in_stack_ffffffffffffffb8;
  positionTy *in_stack_ffffffffffffffc0;
  double local_28;
  
  for (local_28 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da); local_28 < 0.0;
      local_28 = local_28 + 360.0) {
  }
  if ((((-90.0 <= in_XMM0_Qa) && (in_XMM0_Qa <= 90.0)) && (-180.0 <= in_XMM1_Qa)) &&
     (in_XMM1_Qa < 180.0)) {
    positionTy::positionTy
              ((positionTy *)(local_90 + 1),in_XMM0_Qa,in_XMM1_Qa,NAN,NAN,NAN,NAN,NAN,GND_UNKNOWN,
               UNIT_WORLD,UNIT_DEG,FPH_UNKNOWN);
    dAngle = fmod(local_28 + 180.0,360.0);
    vectorTy::vectorTy(local_90,dAngle,10.0,NAN,NAN);
    CoordPlusVector(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    this_00 = (positionTy *)(in_RDI + 0x23);
    positionTy::lat((positionTy *)&stack0xffffffffffffff28);
    positionTy::lon((positionTy *)&stack0xffffffffffffff28);
    std::vector<StartupLoc,std::allocator<StartupLoc>>::
    emplace_back<std::__cxx11::string_const&,double,double,double&>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_RDI,in_RSI,&this_00->_lat);
    pvVar1 = std::vector<StartupLoc,_std::allocator<StartupLoc>_>::back
                       ((vector<StartupLoc,_std::allocator<StartupLoc>_> *)this_00);
    boundingBoxTy::enlarge_pos
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    local_90[0].dist = 50.0;
    CoordPlusVector(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    pVar2 = positionTy::operator_cast_to_ptTy(this_00);
    local_100 = pVar2.x;
    (pvVar1->viaPos).x = local_100;
    local_f8 = pVar2.y;
    (pvVar1->viaPos).y = local_f8;
  }
  return;
}

Assistant:

void AddStartupLoc (const std::string& _id,
                        double _lat, double _lon,
                        double _heading)
    {
        // Heading could be defined negative
        while (_heading < 0.0)
            _heading += 360.0;

        // resonabilit check...then add to our list of startup locations
        if ( -90.0 <= _lat && _lat <= 90.0 &&
            -180.0 <= _lon && _lon < 180.0)
        {
            // The startup location seems to be aligned with the plane's tip
            // while all CSL model's origin is at the center of the full.
            // To (partly) make up for this we move out the startup location
            // by about 10m. (`viaPos` is here just used as temp variable.)
            const positionTy origPos (_lat, _lon);
            vectorTy vec (std::fmod(_heading+180.0, 360.0),
                          APT_STARTUP_MOVE_BACK);
            const positionTy startPos = CoordPlusVector(origPos, vec);

            // now add this moved out position to our list
            vecStartupLocs.emplace_back(_id, startPos.lat(), startPos.lon(), _heading);
            StartupLoc& loc = vecStartupLocs.back();
            bounds.enlarge_pos(loc.lat, loc.lon);       // make sure it becomes part of the airport boundary
            
            // Add another position 50m out as the "via" pos: via which we roll to the startup location
            vec.dist = APT_STARTUP_VIA_DIST;
            loc.viaPos = CoordPlusVector(startPos, vec);
        }
    }